

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O1

Component ftxui::Menu(ConstStringListRef entries,int *selected,Ref<ftxui::MenuOption> *option)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *peVar1;
  Ref<ftxui::MenuOption> *in_R8;
  Component CVar2;
  undefined1 local_41;
  MenuBase *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  Ref<ftxui::MenuOption> *local_30;
  ConstStringListRef local_28;
  
  local_28.ref_ =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)entries.ref_wide_;
  peVar1 = (element_type *)entries.ref_;
  local_40 = (MenuBase *)0x0;
  local_30 = option;
  local_28.ref_wide_ =
       (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        *)selected;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ftxui::MenuBase,std::allocator<ftxui::MenuBase>,ftxui::ConstStringListRef&,int*&,ftxui::Ref<ftxui::MenuOption>&>
            (&local_38,&local_40,(allocator<ftxui::MenuBase> *)&local_41,&local_28,(int **)&local_30
             ,in_R8);
  peVar1->_vptr_ComponentBase = (_func_int **)local_40;
  (peVar1->children_).
  super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (peVar1->children_).
  super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_38._M_pi;
  CVar2.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar2.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  return (Component)CVar2.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Component Menu(ConstStringListRef entries,
               int* selected,
               Ref<MenuOption> option) {
  return Make<MenuBase>(entries, selected, std::move(option));
}